

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

void __thiscall testing::internal::RE::Init(RE *this,char *regex)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *__pattern;
  char *in_R9;
  ostream *poVar4;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  AssertHelper local_58;
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  string local_40;
  
  pcVar3 = (char *)(this->pattern_)._M_string_length;
  strlen(regex);
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar3,(ulong)regex);
  sVar2 = strlen(regex);
  pcVar3 = (char *)operator_new__(sVar2 + 10);
  snprintf(pcVar3,sVar2 + 10,"^(%s)$",regex);
  iVar1 = regcomp((regex_t *)&this->full_regex_,pcVar3,1);
  local_50[0] = (internal)(iVar1 == 0);
  this->is_valid_ = (bool)local_50[0];
  if ((bool)local_50[0]) {
    __pattern = "()";
    if (*regex != '\0') {
      __pattern = regex;
    }
    iVar1 = regcomp((regex_t *)&this->partial_regex_,__pattern,1);
    local_50[0] = (internal)(iVar1 == 0);
    this->is_valid_ = (bool)local_50[0];
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_50[0]) goto LAB_001124f5;
  }
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  Message::Message((Message *)&local_60);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_60._M_head_impl + 0x10),"Regular expression \"",0x14);
  poVar4 = (ostream *)(local_60._M_head_impl + 0x10);
  if (regex == (char *)0x0) {
    sVar2 = 6;
    regex = "(null)";
  }
  else {
    sVar2 = strlen(regex);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,regex,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_60._M_head_impl + 0x10),
             "\" is not a valid POSIX Extended regular expression.",0x33);
  GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_40,local_50,(AssertionResult *)"is_valid_","false","true",in_R9);
  AssertHelper::AssertHelper
            (&local_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]camp/extern/blt/thirdparty_builtin/googletest/googletest/src/gtest-port.cc"
             ,0x2cb,local_40._M_dataplus._M_p);
  AssertHelper::operator=(&local_58,(Message *)&local_60);
  AssertHelper::~AssertHelper(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_60._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_60._M_head_impl + 8))();
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
LAB_001124f5:
  operator_delete__(pcVar3);
  return;
}

Assistant:

void RE::Init(const char* regex) {
  pattern_ = regex;

  // Reserves enough bytes to hold the regular expression used for a
  // full match.
  const size_t full_regex_len = strlen(regex) + 10;
  char* const full_pattern = new char[full_regex_len];

  snprintf(full_pattern, full_regex_len, "^(%s)$", regex);
  is_valid_ = regcomp(&full_regex_, full_pattern, REG_EXTENDED) == 0;
  // We want to call regcomp(&partial_regex_, ...) even if the
  // previous expression returns false.  Otherwise partial_regex_ may
  // not be properly initialized can may cause trouble when it's
  // freed.
  //
  // Some implementation of POSIX regex (e.g. on at least some
  // versions of Cygwin) doesn't accept the empty string as a valid
  // regex.  We change it to an equivalent form "()" to be safe.
  if (is_valid_) {
    const char* const partial_regex = (*regex == '\0') ? "()" : regex;
    is_valid_ = regcomp(&partial_regex_, partial_regex, REG_EXTENDED) == 0;
  }
  EXPECT_TRUE(is_valid_)
      << "Regular expression \"" << regex
      << "\" is not a valid POSIX Extended regular expression.";

  delete[] full_pattern;
}